

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_c.c
# Opt level: O0

int from_octal(char *p,size_t l)

{
  int r;
  size_t l_local;
  char *p_local;
  
  r = 0;
  p_local = p;
  for (l_local = l; l_local != 0; l_local = l_local - 1) {
    r = *p_local + -0x30 + r * 8;
    p_local = p_local + 1;
  }
  return r;
}

Assistant:

static int
from_octal(const char *p, size_t l)
{
	int r = 0;

	while (l > 0) {
		r *= 8;
		r += *p - '0';
		--l;
		++p;
	}
	return (r);
}